

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O2

sexp_conflict
sexp_forkpty_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2,
                 sexp_conflict arg3)

{
  int iVar1;
  sexp_conflict psVar2;
  sexp psVar3;
  ulong uVar4;
  sexp psVar5;
  sexp_conflict res1;
  sexp_conflict res0;
  sexp_conflict res;
  int tmp0;
  sexp_gc_var_t local_158;
  sexp_gc_var_t local_148;
  sexp_gc_var_t local_138;
  char tmp1 [256];
  
  local_148.var = &res1;
  res = (sexp_conflict)0x43e;
  res0 = (sexp_conflict)0x43e;
  res1 = (sexp_conflict)0x43e;
  psVar2 = arg2;
  if (((ulong)arg2 & 3) == 0) {
    if ((arg2 != (sexp_conflict)0x3e) &&
       (uVar4 = (long)(self->value).type.dl >> 1, uVar4 != arg2->tag)) goto LAB_001012c8;
  }
  else if (arg2 != (sexp_conflict)0x3e) {
    uVar4 = (long)(self->value).type.dl >> 1;
    goto LAB_001012c8;
  }
  psVar2 = arg3;
  if (((ulong)arg3 & 3) == 0) {
    if ((arg3 == (sexp_conflict)0x3e) ||
       (uVar4 = (((self->value).type.finalize_name)->value).fileno.fd >> 1, uVar4 == arg3->tag))
    goto LAB_001012db;
  }
  else {
    if (arg3 == (sexp_conflict)0x3e) {
LAB_001012db:
      local_158.var = &res;
      local_138.next = &local_158;
      local_158.next = (ctx->value).context.saves;
      local_138.var = &res0;
      local_148.next = &local_138;
      (ctx->value).context.saves = &local_148;
      if (arg2 == (sexp_conflict)0x3e) {
        psVar5 = (sexp)0x0;
      }
      else {
        psVar5 = (arg2->value).type.slots;
      }
      if (arg3 == (sexp_conflict)0x3e) {
        psVar3 = (sexp)0x0;
      }
      else {
        psVar3 = (arg3->value).type.slots;
      }
      iVar1 = forkpty(&tmp0,tmp1,psVar5,psVar3);
      res = (sexp_conflict)sexp_make_integer(ctx,(long)iVar1,(long)(iVar1 >> 0x1f));
      res0 = (sexp_conflict)sexp_make_fileno_op(ctx,0,2,(long)tmp0 * 2 + 1,0x3e);
      res1 = (sexp_conflict)sexp_c_string(ctx,tmp1,0xffffffffffffffff);
      res = (sexp_conflict)sexp_cons_op(ctx,0,2,res,0x23e);
      sexp_push_op(ctx,&res,(res->value).flonum);
      (((res->value).type.cpl)->value).type.name = res1;
      sexp_push_op(ctx,&res,(res->value).flonum);
      (((res->value).type.cpl)->value).type.name = res0;
      (ctx->value).context.saves = local_158.next;
      return res;
    }
    uVar4 = (((self->value).type.finalize_name)->value).fileno.fd >> 1;
  }
LAB_001012c8:
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,uVar4,psVar2);
  return psVar2;
}

Assistant:

sexp sexp_forkpty_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg2, sexp arg3) {
  int tmp0;
  char tmp1[256];
  sexp_gc_var3(res, res0, res1);
  if (! ((sexp_pointerp(arg2) && (sexp_pointer_tag(arg2) == sexp_unbox_fixnum(sexp_opcode_arg3_type(self)))) || sexp_not(arg2)))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_opcode_arg3_type(self)), arg2);
  if (! ((sexp_pointerp(arg3) && (sexp_pointer_tag(arg3) == sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ZERO)))) || sexp_not(arg3)))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ZERO)), arg3);
  sexp_gc_preserve3(ctx, res, res0, res1);
  res = sexp_make_integer(ctx, forkpty(&tmp0, tmp1, (struct termios*)sexp_cpointer_maybe_null_value(arg2), (struct winsize*)sexp_cpointer_maybe_null_value(arg3)));
  res0 = sexp_make_fileno(ctx, sexp_make_fixnum(tmp0), SEXP_FALSE);
  res1 = sexp_c_string(ctx, tmp1, -1);
  res = sexp_cons(ctx, res, SEXP_NULL);
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res1;
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res0;
  sexp_gc_release3(ctx);
  return res;
}